

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MipsMacros.cpp
# Opt level: O0

unique_ptr<CAssemblerCommand,_std::default_delete<CAssemblerCommand>_>
generateMipsMacroBranch
          (Parser *parser,MipsRegisterData *registers,MipsImmediateData *immediates,int flags)

{
  uint uVar1;
  string *psVar2;
  undefined4 in_register_0000000c;
  MipsImmediateData *immediates_00;
  uint in_R8D;
  bool bVar3;
  bool bVar4;
  bool bVar5;
  initializer_list<AssemblyTemplateArgument> variables;
  AssemblyTemplateArgument *local_2b0;
  char *local_278;
  char *local_258;
  char *local_238;
  char *local_230;
  char *local_228;
  char *local_220;
  char *local_218;
  char *local_210;
  bool local_202;
  allocator<char> local_1ea;
  allocator<char> local_1e9;
  AssemblyTemplateArgument *local_1e8;
  AssemblyTemplateArgument local_1e0;
  char *local_1b8;
  string asStack_1b0 [32];
  char *local_190;
  string asStack_188 [32];
  char *local_168;
  string local_160 [32];
  char *local_140;
  string local_138 [32];
  char *local_118;
  string local_110;
  char *local_f0;
  string local_e8;
  undefined1 local_c8 [16];
  undefined1 local_b8 [8];
  string macroText;
  char *templateRegister;
  char *templateImmediate;
  char *templateNeEq;
  string op;
  bool revcmp;
  bool likely;
  bool immediate;
  bool unsigned_;
  bool bnez;
  bool beqz;
  bool beq;
  bool bne;
  int type;
  char *selectedTemplate;
  int flags_local;
  MipsImmediateData *immediates_local;
  MipsRegisterData *registers_local;
  Parser *parser_local;
  
  immediates_00 = (MipsImmediateData *)CONCAT44(in_register_0000000c,flags);
  uVar1 = in_R8D & 7;
  bVar3 = uVar1 == 1;
  bVar4 = uVar1 != 2;
  bVar5 = uVar1 != 3;
  local_202 = uVar1 == 5 || uVar1 == 3;
  op.field_2._M_local_buf[0xf] = local_202;
  op.field_2._M_local_buf[0xe] = (in_R8D & 0x200) != 0;
  op.field_2._M_local_buf[0xd] = (in_R8D & 0x40000) != 0;
  op.field_2._M_local_buf[0xc] = (in_R8D & 0x80000) != 0;
  std::__cxx11::string::string((string *)&templateNeEq);
  if ((bVar3) || (uVar1 == 6)) {
    _bnez = 
    "\n\t\t\t.if %imm% == 0\n\t\t\t\t%op%\t%rs%,r0,%dest%\n\t\t\t.else\n\t\t\t\tli\t\tr1,%imm%\n\t\t\t\t%op%\t%rs%,r1,%dest%\n\t\t\t.endif\n\t\t"
    ;
    if ((op.field_2._M_local_buf[0xd] & 1U) == 0) {
      if (bVar3) {
        local_218 = "bne";
      }
      else {
        local_218 = "beq";
      }
      std::__cxx11::string::operator=((string *)&templateNeEq,local_218);
    }
    else {
      if (bVar3) {
        local_210 = "bnel";
      }
      else {
        local_210 = "beql";
      }
      std::__cxx11::string::operator=((string *)&templateNeEq,local_210);
    }
  }
  else if (((op.field_2._M_local_buf[0xe] & 1U) == 0) ||
          ((uVar1 != 4 && uVar1 != 5 && (bVar4 && bVar5)))) {
    if ((uVar1 != 4 && uVar1 != 5) && (bVar4 && bVar5)) {
      std::unique_ptr<CAssemblerCommand,std::default_delete<CAssemblerCommand>>::
      unique_ptr<std::default_delete<CAssemblerCommand>,void>
                ((unique_ptr<CAssemblerCommand,std::default_delete<CAssemblerCommand>> *)parser,
                 (nullptr_t)0x0);
      macroText.field_2._12_4_ = 1;
      goto LAB_00215589;
    }
    _bnez = 
    "\n\t\t\t.if %revcmp%\n\t\t\t\tslt%u%\tr1,%rt%,%rs%\n\t\t\t.else\n\t\t\t\tslt%u%\tr1,%rs%,%rt%\n\t\t\t.endif\n\t\t\t%op%\tr1,%dest%\n\t\t"
    ;
    if ((op.field_2._M_local_buf[0xd] & 1U) == 0) {
      if (bVar4 && bVar5) {
        local_238 = "beqz";
      }
      else {
        local_238 = "bnez";
      }
      std::__cxx11::string::operator=((string *)&templateNeEq,local_238);
    }
    else {
      if (bVar4 && bVar5) {
        local_230 = "beqzl";
      }
      else {
        local_230 = "bnezl";
      }
      std::__cxx11::string::operator=((string *)&templateNeEq,local_230);
    }
  }
  else {
    _bnez = 
    "\n\t\t\t.if %revcmp% && %imm% == 0\n\t\t\t\tslt%u% \tr1,r0,%rs%\n\t\t\t.elseif %revcmp%\n\t\t\t\tli\t\tr1,%imm%\n\t\t\t\tslt%u%\tr1,r1,%rs%\n\t\t\t.elseif (%imm% < -0x8000) || (%imm% >= 0x8000)\n\t\t\t\tli\t\tr1,%imm%\n\t\t\t\tslt%u%\tr1,%rs%,r1\n\t\t\t.else\n\t\t\t\tslti%u%\tr1,%rs%,%imm%\n\t\t\t.endif\n\t\t\t%op%\tr1,%dest%\n\t\t"
    ;
    if ((op.field_2._M_local_buf[0xd] & 1U) == 0) {
      if (bVar4 && bVar5) {
        local_228 = "beqz";
      }
      else {
        local_228 = "bnez";
      }
      std::__cxx11::string::operator=((string *)&templateNeEq,local_228);
    }
    else {
      if (bVar4 && bVar5) {
        local_220 = "beqzl";
      }
      else {
        local_220 = "bnezl";
      }
      std::__cxx11::string::operator=((string *)&templateNeEq,local_220);
    }
  }
  preprocessMacro_abi_cxx11_((string *)local_b8,_bnez,immediates_00);
  local_1e8 = &local_1e0;
  local_1e0.variableName = "%op%";
  std::__cxx11::string::string((string *)&local_1e0.value,(string *)&templateNeEq);
  local_1e8 = (AssemblyTemplateArgument *)&local_1b8;
  local_1b8 = "%u%";
  if ((op.field_2._M_local_buf[0xf] & 1U) == 0) {
    local_258 = " ";
  }
  else {
    local_258 = "u";
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(asStack_1b0,local_258,&local_1e9);
  local_1e8 = (AssemblyTemplateArgument *)&local_190;
  local_190 = "%revcmp%";
  if ((op.field_2._M_local_buf[0xc] & 1U) == 0) {
    local_278 = "0";
  }
  else {
    local_278 = "1";
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(asStack_188,local_278,&local_1ea);
  local_1e8 = (AssemblyTemplateArgument *)&local_168;
  local_168 = "%rs%";
  psVar2 = Identifier::string_abi_cxx11_((Identifier *)&(immediates->primary).expression);
  std::__cxx11::string::string(local_160,(string *)psVar2);
  local_1e8 = (AssemblyTemplateArgument *)&local_140;
  local_140 = "%rt%";
  psVar2 = Identifier::string_abi_cxx11_
                     ((Identifier *)
                      &(immediates->secondary).expression.expression.
                       super___shared_ptr<ExpressionInternal,_(__gnu_cxx::_Lock_policy)2>.
                       _M_refcount);
  std::__cxx11::string::string(local_138,(string *)psVar2);
  local_1e8 = (AssemblyTemplateArgument *)&local_118;
  local_118 = "%imm%";
  Expression::toString_abi_cxx11_(&local_110,&(immediates_00->primary).expression);
  local_1e8 = (AssemblyTemplateArgument *)&local_f0;
  local_f0 = "%dest%";
  Expression::toString_abi_cxx11_(&local_e8,&(immediates_00->secondary).expression);
  variables._M_array = (iterator)(ulong)in_R8D;
  local_c8._0_8_ = &local_1e0;
  local_c8._8_8_ = 7;
  variables._M_len = local_c8._0_8_;
  createMacro(parser,(string *)registers,(int)local_b8,variables);
  local_2b0 = (AssemblyTemplateArgument *)local_c8;
  do {
    local_2b0 = local_2b0 + -1;
    AssemblyTemplateArgument::~AssemblyTemplateArgument(local_2b0);
  } while (local_2b0 != &local_1e0);
  std::allocator<char>::~allocator(&local_1ea);
  std::allocator<char>::~allocator(&local_1e9);
  macroText.field_2._12_4_ = 1;
  std::__cxx11::string::~string((string *)local_b8);
LAB_00215589:
  std::__cxx11::string::~string((string *)&templateNeEq);
  return (__uniq_ptr_data<CAssemblerCommand,_std::default_delete<CAssemblerCommand>,_true,_true>)
         (__uniq_ptr_data<CAssemblerCommand,_std::default_delete<CAssemblerCommand>,_true,_true>)
         parser;
}

Assistant:

std::unique_ptr<CAssemblerCommand> generateMipsMacroBranch(Parser& parser, MipsRegisterData& registers, MipsImmediateData& immediates, int flags)
{
	const char* selectedTemplate;

	int type = flags & MIPSM_CONDITIONMASK;

	bool bne = type == MIPSM_NE;
	bool beq = type == MIPSM_EQ;
	bool beqz = type == MIPSM_GE || type == MIPSM_GEU;
	bool bnez = type == MIPSM_LT || type == MIPSM_LTU;
	bool unsigned_ = type == MIPSM_GEU || type == MIPSM_LTU;
	bool immediate = (flags & MIPSM_IMM) != 0;
	bool likely = (flags & MIPSM_LIKELY) != 0;
	bool revcmp = (flags & MIPSM_REVCMP) != 0;

	std::string op;
	if (bne || beq)
	{
		const char* templateNeEq = R"(
			.if %imm% == 0
				%op%	%rs%,r0,%dest%
			.else
				li		r1,%imm%
				%op%	%rs%,r1,%dest%
			.endif
		)";

		selectedTemplate = templateNeEq;
		if(likely)
			op = bne ? "bnel" : "beql";
		else
			op = bne ? "bne" : "beq";
	} else if (immediate && (beqz || bnez))
	{
		const char* templateImmediate = R"(
			.if %revcmp% && %imm% == 0
				slt%u% 	r1,r0,%rs%
			.elseif %revcmp%
				li		r1,%imm%
				slt%u%	r1,r1,%rs%
			.elseif (%imm% < -0x8000) || (%imm% >= 0x8000)
				li		r1,%imm%
				slt%u%	r1,%rs%,r1
			.else
				slti%u%	r1,%rs%,%imm%
			.endif
			%op%	r1,%dest%
		)";

		selectedTemplate = templateImmediate;
		if(likely)
			op = bnez ? "bnezl" : "beqzl";
		else
			op = bnez ? "bnez" : "beqz";
	} else if (beqz || bnez)
	{
		const char* templateRegister = R"(
			.if %revcmp%
				slt%u%	r1,%rt%,%rs%
			.else
				slt%u%	r1,%rs%,%rt%
			.endif
			%op%	r1,%dest%
		)";

		selectedTemplate = templateRegister;
		if(likely)
			op = bnez ? "bnezl" : "beqzl";
		else
			op = bnez ? "bnez" : "beqz";
	} else {
		return nullptr;
	}
	
	std::string macroText = preprocessMacro(selectedTemplate,immediates);
	return createMacro(parser,macroText,flags, {
			{ "%op%",		op },
			{ "%u%",		unsigned_ ? "u" : " "},
			{ "%revcmp%",	revcmp ? "1" : "0"},
			{ "%rs%",		registers.grs.name.string() },
			{ "%rt%",		registers.grt.name.string() },
			{ "%imm%",		immediates.primary.expression.toString() },
			{ "%dest%",	immediates.secondary.expression.toString() },
	});
}